

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_err.c
# Opt level: O1

void uo_print_err(char *fmt,__va_list_tag *args)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (fmt != (char *)0x0) {
    uo_print_err_cold_1();
  }
  if (iVar1 != 0) {
    uo_print_err_cold_2();
  }
  fflush(_stderr);
  return;
}

Assistant:

void uo_print_err(
    const char *fmt,
    va_list args)
{
#ifdef _WIN32
    DWORD winerr = GetLastError();
#endif
    int errno_local = errno;

    if (fmt) 
    {
        vfprintf(stderr, fmt, args);
        fputc('\n', stderr);
    }

    if (errno_local)
        fprintf(stderr, "(errno = %d) : %s\n", errno_local, strerror(errno_local));

#ifdef _WIN32
    if (winerr)
    {
        char buf[256];
        FormatMessage(
            FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS,
            NULL,
            winerr,
            MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
            buf, 
            (sizeof buf / sizeof *buf),
            NULL);
        fprintf(stderr, "(GetLastError() = %d) : %s\n", winerr, buf);
    }
#endif

    fflush(stderr);
}